

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool duckdb_re2::RE2::Replace(string *str,RE2 *re,StringPiece *rewrite)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  string s;
  StringPiece vec [17];
  string local_168;
  StringPiece local_148 [17];
  
  uVar6 = 0;
  switchD_005700f1::default(local_148,0,0x110);
  if (0 < (long)rewrite->size_) {
    pcVar4 = rewrite->data_;
    pcVar3 = pcVar4 + rewrite->size_;
    uVar6 = 0;
    do {
      if (*pcVar4 == '\\') {
        pcVar4 = pcVar4 + 1;
        uVar5 = 0xffffffcf;
        if (pcVar4 < pcVar3) {
          uVar5 = (int)*pcVar4 - 0x30;
        }
        uVar7 = uVar6;
        if ((int)uVar6 < (int)uVar5) {
          uVar7 = uVar5;
        }
        if (uVar5 < 10) {
          uVar6 = uVar7;
        }
      }
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 < pcVar3);
  }
  bVar2 = false;
  if ((uVar6 < 0x11) && (bVar2 = false, (int)uVar6 <= re->num_captures_)) {
    local_168._M_dataplus._M_p = (str->_M_dataplus)._M_p;
    local_168._M_string_length = str->_M_string_length;
    bVar2 = false;
    bVar1 = Match(re,(StringPiece *)&local_168,0,local_168._M_string_length,UNANCHORED,local_148,
                  uVar6 + 1);
    if (bVar1) {
      local_168._M_string_length = 0;
      local_168.field_2._M_local_buf[0] = '\0';
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      bVar2 = Rewrite(re,&local_168,rewrite,local_148,uVar6 + 1);
      if (bVar2) {
        std::__cxx11::string::replace
                  ((ulong)str,(long)local_148[0].data_ - (long)(str->_M_dataplus)._M_p,
                   (char *)local_148[0].size_,(ulong)local_168._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
    }
  }
  return bVar2;
}

Assistant:

bool RE2::Replace(std::string* str,
                  const RE2& re,
                  const StringPiece& rewrite) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > 1 + re.NumberOfCapturingGroups())
    return false;
  if (nvec > static_cast<int>(arraysize(vec)))
    return false;
  if (!re.Match(*str, 0, str->size(), UNANCHORED, vec, nvec))
    return false;

  std::string s;
  if (!re.Rewrite(&s, rewrite, vec, nvec))
    return false;

  assert(vec[0].data() >= str->data());
  assert(vec[0].data() + vec[0].size() <= str->data() + str->size());
  str->replace(vec[0].data() - str->data(), vec[0].size(), s);
  return true;
}